

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Scalar SVar1;
  Scalar *pSVar2;
  ostream *poVar3;
  long lVar4;
  uint uVar5;
  int j;
  long lVar6;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  initializer_list<double> __l_04;
  allocator_type local_269;
  Scalar local_268;
  int local_25c;
  MatrixXd y;
  MatrixXd X;
  MatrixXd se;
  vector<double,_std::allocator<double>_> labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  dataset;
  void *local_1c0 [3];
  undefined1 local_1a8 [24];
  vector<double,_std::allocator<double>_> vStack_190;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  LhsNested local_148;
  RhsNested pMStack_140;
  DenseStorage<double,__1,__1,__1,_0> local_130;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_118;
  DenseStorage<double,__1,__1,__1,_0> local_100;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  ANN n;
  
  ANN::ANN(&n);
  ANN::setLearningRate(&n,0.1);
  ANN::setInputSize(&n,2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"tanh",(allocator<char> *)local_1a8);
  ANN::addLayer(&n,3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"tanh",(allocator<char> *)local_1a8);
  ANN::addLayer(&n,3,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"tanh",(allocator<char> *)local_1a8);
  ANN::addLayer(&n,1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&labels;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1a8,__l,(allocator_type *)&local_148);
  X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = 0;
  X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._4_4_ = 0;
  X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows._0_4_ = 0;
  X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows._4_4_ =
       0x3ff00000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&X;
  std::vector<double,_std::allocator<double>_>::vector
            (&vStack_190,__l_00,(allocator_type *)&local_118);
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&y;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_178,__l_01,(allocator_type *)local_1c0);
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&se;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_160,__l_02,(allocator_type *)&local_25c);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)local_1a8;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&dataset,__l_03,&local_269);
  lVar4 = 0x48;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)(local_1a8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_1a8._16_8_ = (RhsNested)0x3ff0000000000000;
  vStack_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  local_1a8._0_8_ = (pointer)0xbff0000000000000;
  local_1a8._8_8_ = (LhsNested)0x3ff0000000000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_1a8;
  std::vector<double,_std::allocator<double>_>::vector(&labels,__l_04,(allocator_type *)&X);
  local_1a8._0_4_ = 4;
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       CONCAT44(y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data.
                _4_4_,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&X,(int *)local_1a8,(int *)&y);
  local_1a8._0_4_ = 4;
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       CONCAT44(se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                ._4_4_,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&y,(int *)local_1a8,(int *)&se);
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    local_268 = **(Scalar **)
                  ((long)&((dataset.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar6);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&X,lVar4,0);
    *pSVar2 = local_268;
    local_268 = *(Scalar *)
                 (*(long *)((long)&((dataset.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar6) + 8);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&X,lVar4,1);
    *pSVar2 = local_268;
    local_268 = labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&y,lVar4,0);
    *pSVar2 = local_268;
    lVar6 = lVar6 + 0x18;
  }
  for (uVar5 = 0; uVar5 != 1000; uVar5 = uVar5 + 1) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_e8,(DenseStorage<double,__1,__1,__1,_0> *)&X);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_100,(DenseStorage<double,__1,__1,__1,_0> *)&y);
    ANN::fit(&n,(MatrixXd *)&local_e8,(MatrixXd *)&local_100);
    free(local_100.m_data);
    free(local_e8.m_data);
    if ((short)((short)((uVar5 & 0xffff) / 10) * -10 + (short)uVar5) == 0) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_130,(DenseStorage<double,__1,__1,__1,_0> *)&X);
      ANN::predict((MatrixXd *)local_1c0,&n,(MatrixXd *)&local_130);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                (&local_118,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&y,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1c0);
      local_148 = local_118.m_lhs;
      pMStack_140 = local_118.m_rhs;
      local_25c = 2;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::pow<int>((type *)local_1a8,
                 (ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_148,&local_25c);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&se,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_1a8);
      free(local_1c0[0]);
      free(local_130.m_data);
      poVar3 = std::operator<<((ostream *)&std::cout,"Epoch: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
      std::operator<<(poVar3," MSE: ");
      SVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&se);
      poVar3 = std::ostream::_M_insert<double>(SVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
      free(se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    }
  }
  free(y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free((void *)CONCAT44(X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_data._4_4_,
                        X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_data._0_4_));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&labels.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&dataset);
  ANN::~ANN(&n);
  return 0;
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setLearningRate(0.1);
    n.setInputSize(2);
    n.addLayer(3, "tanh");
    n.addLayer(3, "tanh");
    n.addLayer(1, "tanh");

    vector<vector<double>> dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> labels = {-1, 1, 1, -1};
    
    Eigen::MatrixXd X = Eigen::MatrixXd(4, 2);
    Eigen::MatrixXd y = Eigen::MatrixXd(4, 1);
    
    for(int j = 0; j < 4; j++) {
        X(j,0) = dataset[j][0];
        X(j,1) = dataset[j][1];
        y(j,0) = labels[j];
    }
    
    for(int i = 0; i < 1000; i++) {
        n.fit(X, y);
        if(i % 10 == 0) {
            Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            cout << "Epoch: " << i << " MSE: " << se.mean() << endl;
        }
    }
    return 0;
}